

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void QApplication::setFont(QFont *font,char *className)

{
  bool bVar1;
  QWidget *pQVar2;
  qsizetype qVar3;
  QWidget **ppQVar4;
  const_iterator o;
  QGraphicsScene **ppQVar5;
  ulong uVar6;
  QFont *this;
  char *in_RSI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  QList<QGraphicsScene_*> *scenes;
  QWidget *w;
  FontHash *hash;
  ConstIterator it_1;
  ConstIterator cend;
  ConstIterator it;
  QWidgetList wids;
  QEvent e;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
  *in_stack_ffffffffffffff48;
  QWidget *in_stack_ffffffffffffff50;
  const_iterator local_68;
  QWidget **local_60;
  const_iterator local_58;
  const_iterator local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QWidget *)
           QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::
           operator()(in_stack_ffffffffffffff48);
  if (in_RSI == (char *)0x0) {
    QGuiApplication::setFont(in_RDI);
    if ((pQVar2 != (QWidget *)0x0) &&
       (qVar3 = QHash<QByteArray,_QFont>::size((QHash<QByteArray,_QFont> *)pQVar2), qVar3 != 0)) {
      QHash<QByteArray,_QFont>::clear((QHash<QByteArray,_QFont> *)in_stack_ffffffffffffff50);
    }
  }
  else if (pQVar2 != (QWidget *)0x0) {
    QByteArray::QByteArray(&local_20,in_RSI,-1);
    QHash<QByteArray,_QFont>::insert
              ((QHash<QByteArray,_QFont> *)pQVar2,(QByteArray *)in_stack_ffffffffffffff48,
               (QFont *)0x2cbf7f);
    QByteArray::~QByteArray((QByteArray *)0x2cbf96);
    in_stack_ffffffffffffff50 = pQVar2;
  }
  if ((((byte)QCoreApplicationPrivate::is_app_running & 1) != 0) &&
     (((byte)QCoreApplicationPrivate::is_app_closing & 1) == 0)) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_30,ApplicationFontChange);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    allWidgets();
    local_50.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_50 = QList<QWidget_*>::constBegin((QList<QWidget_*> *)in_stack_ffffffffffffff50);
    local_58.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = QList<QWidget_*>::constEnd((QList<QWidget_*> *)in_stack_ffffffffffffff50);
    while( true ) {
      local_60 = local_58.i;
      bVar1 = QList<QWidget_*>::const_iterator::operator!=(&local_50,local_58);
      if (!bVar1) break;
      ppQVar4 = QList<QWidget_*>::const_iterator::operator*(&local_50);
      pQVar2 = *ppQVar4;
      bVar1 = QWidget::isWindow(in_stack_ffffffffffffff50);
      if ((!bVar1) &&
         (bVar1 = QObject::inherits(&in_stack_ffffffffffffff50->super_QObject,
                                    (char *)in_stack_ffffffffffffff48), bVar1)) {
        QCoreApplication::sendEvent(&pQVar2->super_QObject,(QEvent *)&local_30);
      }
      QList<QWidget_*>::const_iterator::operator++(&local_50);
    }
    QCoreApplication::instance();
    d_func((QApplication *)0x2cc0df);
    local_68.i = (QGraphicsScene **)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = QList<QGraphicsScene_*>::constBegin
                         ((QList<QGraphicsScene_*> *)in_stack_ffffffffffffff50);
    while( true ) {
      o = QList<QGraphicsScene_*>::constEnd((QList<QGraphicsScene_*> *)in_stack_ffffffffffffff50);
      bVar1 = QList<QGraphicsScene_*>::const_iterator::operator!=(&local_68,o);
      if (!bVar1) break;
      ppQVar5 = QList<QGraphicsScene_*>::const_iterator::operator*(&local_68);
      QCoreApplication::sendEvent(&(*ppQVar5)->super_QObject,(QEvent *)&local_30);
      QList<QGraphicsScene_*>::const_iterator::operator++(&local_68);
    }
    QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2cc159);
    QEvent::~QEvent((QEvent *)&local_30);
  }
  if ((in_RSI == (char *)0x0) &&
     ((QApplicationPrivate::sys_font == (QFont *)0x0 ||
      (uVar6 = QFont::isCopyOf(in_RDI), (uVar6 & 1) == 0)))) {
    if (QApplicationPrivate::set_font == (QFont *)0x0) {
      this = (QFont *)operator_new(0x10);
      QFont::QFont(this,in_RDI);
      QApplicationPrivate::set_font = this;
    }
    else {
      QFont::operator=(QApplicationPrivate::set_font,in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplication::setFont(const QFont &font, const char *className)
{
    FontHash *hash = app_fonts();
    if (!className) {
        QGuiApplication::setFont(font);
        if (hash && hash->size())
            hash->clear();
    } else if (hash) {
        hash->insert(className, font);
    }
    if (QApplicationPrivate::is_app_running && !QApplicationPrivate::is_app_closing) {
        QEvent e(QEvent::ApplicationFontChange);
        QWidgetList wids = QApplication::allWidgets();
        for (QWidgetList::ConstIterator it = wids.constBegin(), cend = wids.constEnd(); it != cend; ++it) {
            QWidget *w = *it;
            if (!w->isWindow() && w->inherits(className)) // matching class
                sendEvent(w, &e);
        }

#if QT_CONFIG(graphicsview)
        // Send to all scenes as well.
        QList<QGraphicsScene *> &scenes = qApp->d_func()->scene_list;
        for (QList<QGraphicsScene *>::ConstIterator it = scenes.constBegin();
             it != scenes.constEnd(); ++it) {
            QCoreApplication::sendEvent(*it, &e);
        }
#endif // QT_CONFIG(graphicsview)
    }
    if (!className && (!QApplicationPrivate::sys_font || !font.isCopyOf(*QApplicationPrivate::sys_font))) {
        if (!QApplicationPrivate::set_font)
            QApplicationPrivate::set_font = new QFont(font);
        else
            *QApplicationPrivate::set_font = font;
    }
}